

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

int cpu_ldsw_data_arm(CPUArchState_conflict *env,target_ulong_conflict ptr)

{
  uint64_t uVar1;
  
  uVar1 = load_helper(env,ptr,*(byte *)((long)&env->hflags + 3) & 0xf | 0x10,0,MO_16,false,
                      full_le_lduw_mmu);
  return (int)(short)uVar1;
}

Assistant:

int cpu_ldsw_data(CPUArchState *env, target_ulong ptr)
{
    return cpu_ldsw_data_ra(env, ptr, 0);
}